

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O2

void __thiscall
anurbs::TrimmedSurfaceClipping::compute_span
          (TrimmedSurfaceClipping *this,Index index_u,Index index_v,Interval span_u,Interval span_v)

{
  pointer pIVar1;
  pointer ppPVar2;
  PolyNode *pPVar3;
  pointer this_00;
  bool bVar4;
  int iVar5;
  PolyNode *this_01;
  long lVar6;
  IntPoint *pt_1;
  pointer pIVar7;
  IntPoint *pt;
  ulong uVar8;
  vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_> regions;
  Vector point;
  Paths clip;
  Polygon region;
  _Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1f8;
  _Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1e0;
  Vector point_1;
  PolyTree polytree;
  Clipper clipper;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector(&clip,1,(allocator_type *)&clipper);
  ClipperLib::PolyTree::PolyTree(&polytree);
  this_00 = clip.
            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  clipper._vptr_Clipper = (_func_int **)(long)(span_u.m_t0 / this->m_scale);
  clipper.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(long)(span_v.m_t0 / this->m_scale);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (clip.
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(value_type *)&clipper);
  region.outer_path.
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)(span_u.m_t1 / this->m_scale);
  region.outer_path.
  super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(long)(span_v.m_t0 / this->m_scale);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (this_00,(value_type *)&region);
  regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(long)(span_u.m_t1 / this->m_scale);
  regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(long)(span_v.m_t1 / this->m_scale);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (this_00,(value_type *)&regions);
  point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       (double)(long)(span_u.m_t0 / this->m_scale);
  point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       (double)(long)(span_v.m_t1 / this->m_scale);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
            (this_00,(value_type *)&point);
  ClipperLib::Clipper::Clipper(&clipper,0);
  ClipperLib::ClipperBase::AddPaths
            ((ClipperBase *)(clipper._vptr_Clipper[-3] + (long)&clipper),&this->m_paths,ptSubject,
             true);
  ClipperLib::ClipperBase::AddPaths
            ((ClipperBase *)(clipper._vptr_Clipper[-3] + (long)&clipper._vptr_Clipper),&clip,ptClip,
             true);
  ClipperLib::Clipper::Execute(&clipper,ctIntersection,&polytree,pftNonZero,pftNonZero);
  this_01 = ClipperLib::PolyTree::GetFirst(&polytree);
  regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  regions.super__Vector_base<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = ClipperLib::PolyTree::Total(&polytree);
  if (iVar5 == 0) {
    lVar6 = ((long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4) * index_u;
    (this->m_span_trim_type).
    super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6 + index_v] = Empty;
    std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::operator=
              ((this->m_span_polygons).
               super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar6 + index_v,
               (initializer_list<anurbs::Polygon>)ZEXT816(0));
  }
  else {
    iVar5 = ClipperLib::PolyTree::Total(&polytree);
    if ((iVar5 == 1) &&
       ((long)(this_01->Contour).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this_01->Contour).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x40)) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&local_1e0,
                 clip.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&local_1f8,
                 &this_01->Contour);
      bVar4 = is_rect((Path *)&local_1e0,(Path *)&local_1f8);
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&local_1f8);
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&local_1e0);
      if (bVar4) {
        lVar6 = ((long)(this->m_spans_v).
                       super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_spans_v).
                       super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 4) * index_u;
        (this->m_span_trim_type).
        super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6 + index_v] = Full;
        std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::operator=
                  ((this->m_span_polygons).
                   super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar6 + index_v,
                   (initializer_list<anurbs::Polygon>)ZEXT816(0));
        goto LAB_0019d814;
      }
    }
    for (; this_01 != (PolyNode *)0x0; this_01 = ClipperLib::PolyNode::GetNext(this_01)) {
      bVar4 = ClipperLib::PolyNode::IsHole(this_01);
      if (!bVar4) {
        region.inner_paths.
        super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        region.inner_paths.
        super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        region.outer_path.
        super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        region.inner_paths.
        super__Vector_base<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        region.outer_path.
        super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        region.outer_path.
        super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
        ::reserve(&region.outer_path,
                  (long)(this_01->Contour).
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_01->Contour).
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
        pIVar1 = (this_01->Contour).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pIVar7 = (this_01->Contour).
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start; pIVar7 != pIVar1;
            pIVar7 = pIVar7 + 1) {
          point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
          [0] = this->m_scale * (double)pIVar7->X;
          point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
          [1] = this->m_scale * (double)pIVar7->Y;
          std::
          vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>::
          emplace_back<Eigen::Matrix<double,1,2,1,1,2>>
                    ((vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>
                      *)&region,(Matrix<double,_1,_2,_1,_1,_2> *)&point);
        }
        for (uVar8 = 0;
            ppPVar2 = (this_01->Childs).
                      super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)((long)(this_01->Childs).
                                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3);
            uVar8 = uVar8 + 1) {
          point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
          [0] = 0.0;
          point.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
          [1] = 0.0;
          pPVar3 = ppPVar2[uVar8];
          std::
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::reserve((vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                     *)&point,
                    (long)*(pointer *)
                           ((long)&(pPVar3->Contour).
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl + 8) -
                    *(long *)&(pPVar3->Contour).
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data >> 4);
          pPVar3 = (this_01->Childs).
                   super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8];
          pIVar1 = *(pointer *)
                    ((long)&(pPVar3->Contour).
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl + 8);
          for (pIVar7 = (pPVar3->Contour).
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start; pIVar7 != pIVar1;
              pIVar7 = pIVar7 + 1) {
            point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
            array[0] = this->m_scale * (double)pIVar7->X;
            point_1.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
            array[1] = this->m_scale * (double)pIVar7->Y;
            std::
            vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>
            ::emplace_back<Eigen::Matrix<double,1,2,1,1,2>>
                      ((vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>
                        *)&point,&point_1);
          }
          std::
          vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
          ::push_back(&region.inner_paths,(value_type *)&point);
          std::
          _Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           *)&point);
        }
        std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::push_back(&regions,&region);
        Polygon::~Polygon(&region);
      }
    }
    lVar6 = ((long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_spans_v).
                   super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4) * index_u;
    (this->m_span_trim_type).
    super__Vector_base<anurbs::TrimTypes,_std::allocator<anurbs::TrimTypes>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6 + index_v] = trimmed;
    std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::operator=
              ((this->m_span_polygons).
               super__Vector_base<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>,_std::allocator<std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar6 + index_v,&regions);
  }
LAB_0019d814:
  std::vector<anurbs::Polygon,_std::allocator<anurbs::Polygon>_>::~vector(&regions);
  ClipperLib::Clipper::~Clipper(&clipper);
  ClipperLib::PolyTree::~PolyTree(&polytree);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&clip);
  return;
}

Assistant:

void compute_span(const Index index_u, const Index index_v, const Interval span_u, const Interval span_v)
    {
        ClipperLib::Paths clip(1);
        ClipperLib::PolyTree polytree;

        clip[0] << to_int_pt(span_u.t0(), span_v.t0())
                << to_int_pt(span_u.t1(), span_v.t0())
                << to_int_pt(span_u.t1(), span_v.t1())
                << to_int_pt(span_u.t0(), span_v.t1());

        ClipperLib::Clipper clipper;
        clipper.AddPaths(m_paths, ClipperLib::ptSubject, true);
        clipper.AddPaths(clip, ClipperLib::ptClip, true);
        clipper.Execute(ClipperLib::ctIntersection, polytree,
            ClipperLib::pftNonZero, ClipperLib::pftNonZero);

        ClipperLib::PolyNode* polynode = polytree.GetFirst();

        std::vector<Polygon> regions;

        if (polytree.Total() == 0) {
            span_trim_type(index_u, index_v) = TrimTypes::Empty;
            span_polygons(index_u, index_v) = {};
            return;
        }

        if (polytree.Total() == 1) {
            const auto& contour = polynode->Contour;

            if (contour.size() == 4 && is_rect(clip[0], contour)) {
                span_trim_type(index_u, index_v) = TrimTypes::Full;
                span_polygons(index_u, index_v) = {};
                return;
            }
        }

        while (polynode) {
            if (!polynode->IsHole()) {
                const auto& outer_contour = polynode->Contour;
                const auto& inner_contours = polynode->Childs;

                Polygon region;

                region.outer_path.reserve(outer_contour.size());

                for (const auto& pt : outer_contour) {
                    region.outer_path.push_back(from_int_pt(pt));
                }

                for (std::size_t i = 0; i < inner_contours.size(); i++) {
                    typename Polygon::Path inner_path;

                    inner_path.reserve(inner_contours[i]->Contour.size());

                    for (const auto& pt : inner_contours[i]->Contour) {
                        inner_path.push_back(from_int_pt(pt));
                    }

                    region.inner_paths.push_back(inner_path);
                }

                regions.push_back(region);
            }

            polynode = polynode->GetNext();
        }

        span_trim_type(index_u, index_v) = TrimTypes::trimmed;
        span_polygons(index_u, index_v) = regions;
    }